

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

IterationConfig * __thiscall
deqp::gles31::Functional::anon_unknown_1::PointRenderCase::generateConfig
          (IterationConfig *__return_storage_ptr__,PointRenderCase *this,int iteration,
          IVec2 *renderTargetSize)

{
  float fVar1;
  float fVar2;
  int i;
  long lVar3;
  float local_20 [4];
  
  BBoxRenderCase::generateRandomConfig
            (__return_storage_ptr__,&this->super_BBoxRenderCase,iteration * 0xdedede,
             renderTargetSize);
  if ((this->super_BBoxRenderCase).m_bboxSize < BBOXSIZE_SMALLER) {
    fVar1 = (__return_storage_ptr__->patternSize).m_data[0];
    fVar2 = (__return_storage_ptr__->patternSize).m_data[1];
    if ((this->super_BBoxRenderCase).m_hasTessellationStage == true) {
      local_20[0] = fVar1 * 0.07;
      local_20[1] = fVar2 * 0.07;
      local_20[2] = 0.0;
      local_20[3] = 0.0;
      lVar3 = 0;
      do {
        (__return_storage_ptr__->bbox).min.m_data[lVar3] =
             (__return_storage_ptr__->bbox).min.m_data[lVar3] - local_20[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      local_20[2] = 0.0;
      local_20[3] = 0.0;
      lVar3 = 0;
      do {
        (__return_storage_ptr__->bbox).max.m_data[lVar3] =
             local_20[lVar3] + (__return_storage_ptr__->bbox).max.m_data[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
    }
    if ((this->super_BBoxRenderCase).m_hasGeometryStage == true) {
      local_20[0] = fVar1 * 0.05;
      local_20[1] = fVar2 * 0.02;
      local_20[2] = 0.0;
      local_20[3] = 0.0;
      lVar3 = 0;
      do {
        (__return_storage_ptr__->bbox).min.m_data[lVar3] =
             (__return_storage_ptr__->bbox).min.m_data[lVar3] - local_20[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      local_20[1] = fVar2 * 0.03;
      local_20[2] = 0.0;
      local_20[3] = 0.0;
      lVar3 = 0;
      do {
        (__return_storage_ptr__->bbox).max.m_data[lVar3] =
             local_20[lVar3] + (__return_storage_ptr__->bbox).max.m_data[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

PointRenderCase::IterationConfig PointRenderCase::generateConfig (int iteration, const tcu::IVec2& renderTargetSize) const
{
	IterationConfig config = generateRandomConfig(0xDEDEDEu * (deUint32)iteration, renderTargetSize);

	// equal or larger -> expand according to shader expansion
	if (m_bboxSize == BBOXSIZE_EQUAL || m_bboxSize == BBOXSIZE_LARGER)
	{
		const tcu::Vec2 patternScale = config.patternSize;

		if (m_hasTessellationStage)
		{
			config.bbox.min -= tcu::Vec4(0.07f * patternScale.x(), 0.07f * patternScale.y(), 0.0f, 0.0f);
			config.bbox.max += tcu::Vec4(0.07f * patternScale.x(), 0.07f * patternScale.y(), 0.0f, 0.0f);
		}
		if (m_hasGeometryStage)
		{
			config.bbox.min -= tcu::Vec4(0.05f * patternScale.x(), 0.02f * patternScale.y(), 0.0f, 0.0f);
			config.bbox.max += tcu::Vec4(0.05f * patternScale.x(), 0.03f * patternScale.y(), 0.0f, 0.0f);
		}
	}

	return config;
}